

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O0

void __thiscall
glcts::anon_unknown_0::PIQBase::VerifyGetProgramResourceName
          (PIQBase *this,GLuint program,GLenum programInterface,GLuint index,string *expected,
          long *error)

{
  bool bVar1;
  undefined8 uVar2;
  int local_43c;
  GLchar local_438 [4];
  GLsizei len;
  GLchar name [1024];
  long *error_local;
  string *expected_local;
  GLuint index_local;
  GLenum programInterface_local;
  GLuint program_local;
  PIQBase *this_local;
  
  memset(local_438,0,0x400);
  glu::CallLogWrapper::glGetProgramResourceName
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program,
             programInterface,index,0x400,&local_43c,local_438);
  if (((local_43c < 1) || (0x3ff < local_43c)) || (local_438[local_43c + -1] == '\0')) {
    anon_unknown_0::Output
              ("ERROR: Length in glGetProgramResourceName should not count null terminator!\n");
    *error = -1;
  }
  else {
    bVar1 = std::operator!=(local_438,expected);
    if ((bVar1) || (local_438[local_43c] != '\0')) {
      uVar2 = std::__cxx11::string::c_str();
      anon_unknown_0::Output("ERROR: Got %s, expected %s\n",local_438,uVar2);
      *error = -1;
    }
  }
  return;
}

Assistant:

virtual inline void VerifyGetProgramResourceName(GLuint program, GLenum programInterface, GLuint index,
													 const std::string& expected, long& error)
	{
		GLchar  name[1024] = { '\0' };
		GLsizei len;
		glGetProgramResourceName(program, programInterface, index, 1024, &len, name);
		if (len <= 0 || len > 1023 || name[len - 1] == '\0')
		{
			Output("ERROR: Length in glGetProgramResourceName should not count null terminator!\n");
			error = ERROR;
		}
		else if (name != expected || name[len] != '\0')
		{
			Output("ERROR: Got %s, expected %s\n", name, expected.c_str());
			error = ERROR;
		}
	}